

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O2

int __thiscall
icu_63::UnifiedCache::_poll(UnifiedCache *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  UBool UVar1;
  UHashElement *element;
  undefined4 in_register_0000000c;
  int iVar2;
  Mutex lock;
  Mutex local_40;
  SharedObject **local_38;
  
  local_40.fMutex = &gCacheMutex;
  local_38 = (SharedObject **)__nfds;
  umtx_lock_63(&gCacheMutex);
  element = uhash_find_63(this->fHashtable,__fds);
  do {
    if (element == (UHashElement *)0x0) {
      iVar2 = 0;
      _putNew(this,(CacheKeyBase *)__fds,this->fNoValue,U_ZERO_ERROR,
              (UErrorCode *)CONCAT44(in_register_0000000c,__timeout));
LAB_002a6aba:
      Mutex::~Mutex(&local_40);
      return iVar2;
    }
    UVar1 = _inProgress(this,element);
    if (UVar1 == '\0') {
      _fetch(this,element,local_38,(UErrorCode *)CONCAT44(in_register_0000000c,__timeout));
      iVar2 = 0x3ae801;
      goto LAB_002a6aba;
    }
    umtx_condWait_63(&gInProgressValueAddedCond,&gCacheMutex);
    element = uhash_find_63(this->fHashtable,__fds);
  } while( true );
}

Assistant:

UBool UnifiedCache::_poll(
        const CacheKeyBase &key,
        const SharedObject *&value,
        UErrorCode &status) const {
    U_ASSERT(value == NULL);
    U_ASSERT(status == U_ZERO_ERROR);
    Mutex lock(&gCacheMutex);
    const UHashElement *element = uhash_find(fHashtable, &key);

    // If the hash table contains an inProgress placeholder entry for this key,
    // this means that another thread is currently constructing the value object.
    // Loop, waiting for that construction to complete.
     while (element != NULL && _inProgress(element)) {
        umtx_condWait(&gInProgressValueAddedCond, &gCacheMutex);
        element = uhash_find(fHashtable, &key);
    }

    // If the hash table contains an entry for the key,
    // fetch out the contents and return them.
    if (element != NULL) {
         _fetch(element, value, status);
        return TRUE;
    }

    // The hash table contained nothing for this key.
    // Insert an inProgress place holder value.
    // Our caller will create the final value and update the hash table.
    _putNew(key, fNoValue, U_ZERO_ERROR, status);
    return FALSE;
}